

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRhsStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,int i,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newRhs,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *oldRhs)

{
  uint *puVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  Status *pSVar5;
  pointer pnVar6;
  Real RVar7;
  undefined8 uVar8;
  type_conflict5 tVar9;
  bool bVar10;
  Status SVar11;
  double *pdVar12;
  SPxInternalCodeException *this_00;
  cpp_dec_float<100U,_int,_void> local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  currLhs;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  
  pSVar5 = (this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data;
  pnVar6 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  currLhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[i].m_backend.data;
  currLhs.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
  currLhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  currLhs.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x20);
  currLhs.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  currLhs.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x30);
  currLhs.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  currLhs.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
  iVar2 = pnVar6[i].m_backend.exp;
  bVar10 = pnVar6[i].m_backend.neg;
  fVar3 = pnVar6[i].m_backend.fpclass;
  iVar4 = pnVar6[i].m_backend.prec_elem;
  currLhs.m_backend.exp = iVar2;
  currLhs.m_backend.neg = bVar10;
  currLhs.m_backend.fpclass = fVar3;
  currLhs.m_backend.prec_elem = iVar4;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_3f8,0.0,(type *)0x0);
  switch(pSVar5[i]) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    if (this->theRep == ROW) {
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      tVar9 = boost::multiprecision::operator>(&this->theShift,(double *)&result_1);
      if (tVar9) {
        forceRecompNonbasicValue(this);
      }
    }
    SVar11 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(&this->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,i);
    pSVar5[i] = SVar11;
    break;
  case P_FIXED:
    local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRhs->m_backend).data._M_elems;
    local_2b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((newRhs->m_backend).data._M_elems + 2)
    ;
    local_2b8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 4);
    local_2b8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 6);
    local_2b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
    local_2b8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 10);
    local_2b8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xc);
    local_2b8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xe);
    local_2b8.m_backend.exp = (newRhs->m_backend).exp;
    local_2b8.m_backend.neg = (newRhs->m_backend).neg;
    local_2b8.m_backend.fpclass = (newRhs->m_backend).fpclass;
    local_2b8.m_backend.prec_elem = (newRhs->m_backend).prec_elem;
    local_178.m_backend.data._M_elems[0] = currLhs.m_backend.data._M_elems[0];
    local_178.m_backend.data._M_elems[1] = currLhs.m_backend.data._M_elems[1];
    local_178.m_backend.data._M_elems[2] = currLhs.m_backend.data._M_elems[2];
    local_178.m_backend.data._M_elems[3] = currLhs.m_backend.data._M_elems[3];
    local_178.m_backend.data._M_elems[4] = currLhs.m_backend.data._M_elems[4];
    local_178.m_backend.data._M_elems[5] = currLhs.m_backend.data._M_elems[5];
    local_178.m_backend.data._M_elems[6] = currLhs.m_backend.data._M_elems[6];
    local_178.m_backend.data._M_elems[7] = currLhs.m_backend.data._M_elems[7];
    local_178.m_backend.data._M_elems[8] = currLhs.m_backend.data._M_elems[8];
    local_178.m_backend.data._M_elems[9] = currLhs.m_backend.data._M_elems[9];
    local_178.m_backend.data._M_elems[10] = currLhs.m_backend.data._M_elems[10];
    local_178.m_backend.data._M_elems[0xb] = currLhs.m_backend.data._M_elems[0xb];
    local_178.m_backend.data._M_elems[0xc] = currLhs.m_backend.data._M_elems[0xc];
    local_178.m_backend.data._M_elems[0xd] = currLhs.m_backend.data._M_elems[0xd];
    local_178.m_backend.data._M_elems[0xe] = currLhs.m_backend.data._M_elems[0xe];
    local_178.m_backend.data._M_elems[0xf] = currLhs.m_backend.data._M_elems[0xf];
    local_178.m_backend.exp = iVar2;
    local_178.m_backend.neg = bVar10;
    local_178.m_backend.fpclass = fVar3;
    local_178.m_backend.prec_elem = iVar4;
    RVar7 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar10 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_2b8,&local_178,RVar7);
    if ((bVar10) && (pSVar5[i] = P_ON_LOWER, this->initialized == true)) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    }
    break;
  default:
    this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&result_1,"XCHANG04 This should never happen.",(allocator *)&result);
    SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&result_1);
    __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRhs->m_backend).data._M_elems;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((newRhs->m_backend).data._M_elems + 2)
    ;
    local_268.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 6);
    local_268.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
    local_268.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 10);
    local_268.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xc);
    local_268.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xe);
    local_268.m_backend.exp = (newRhs->m_backend).exp;
    local_268.m_backend.neg = (newRhs->m_backend).neg;
    local_268.m_backend.fpclass = (newRhs->m_backend).fpclass;
    local_268.m_backend.prec_elem = (newRhs->m_backend).prec_elem;
    local_128.m_backend.data._M_elems[0] = currLhs.m_backend.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = currLhs.m_backend.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = currLhs.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = currLhs.m_backend.data._M_elems[3];
    local_128.m_backend.data._M_elems[4] = currLhs.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = currLhs.m_backend.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = currLhs.m_backend.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = currLhs.m_backend.data._M_elems[7];
    local_128.m_backend.data._M_elems[8] = currLhs.m_backend.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = currLhs.m_backend.data._M_elems[9];
    local_128.m_backend.data._M_elems[10] = currLhs.m_backend.data._M_elems[10];
    local_128.m_backend.data._M_elems[0xb] = currLhs.m_backend.data._M_elems[0xb];
    local_128.m_backend.data._M_elems[0xc] = currLhs.m_backend.data._M_elems[0xc];
    local_128.m_backend.data._M_elems[0xd] = currLhs.m_backend.data._M_elems[0xd];
    local_128.m_backend.data._M_elems[0xe] = currLhs.m_backend.data._M_elems[0xe];
    local_128.m_backend.data._M_elems[0xf] = currLhs.m_backend.data._M_elems[0xf];
    local_128.m_backend.exp = iVar2;
    local_128.m_backend.neg = bVar10;
    local_128.m_backend.fpclass = fVar3;
    local_128.m_backend.prec_elem = iVar4;
    RVar7 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar10 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_268,&local_128,RVar7);
    if (bVar10) {
      pSVar5[i] = P_FIXED;
    }
    break;
  case P_ON_UPPER:
    pdVar12 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&result_1.m_backend,*pdVar12,(type *)0x0);
    tVar9 = boost::multiprecision::operator>=(newRhs,&result_1);
    if (tVar9) {
      pdVar12 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&result_1.m_backend,-*pdVar12,(type *)0x0);
      tVar9 = boost::multiprecision::operator<=
                        (&currLhs,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&result_1.m_backend);
      if (tVar9) {
        pSVar5[i] = P_FREE;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar6 = (this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[i].m_backend.data;
        result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[i].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x10);
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x20);
        result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar6[i].m_backend.data + 0x30);
        result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 2);
        result.m_backend.data._M_elems._56_5_ = SUB85(uVar8,0);
        result.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        result.m_backend.exp = pnVar6[i].m_backend.exp;
        result.m_backend.neg = pnVar6[i].m_backend.neg;
        result.m_backend.fpclass = pnVar6[i].m_backend.fpclass;
        result.m_backend.prec_elem = pnVar6[i].m_backend.prec_elem;
        if (result.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&result.m_backend,&oldRhs->m_backend);
      }
      else {
        pSVar5[i] = P_ON_LOWER;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems._56_5_ = 0;
        result.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result.m_backend,
                   &(this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&currLhs.m_backend);
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x10;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems[6] = 0;
        result_3.m_backend.data._M_elems[7] = 0;
        result_3.m_backend.data._M_elems[8] = 0;
        result_3.m_backend.data._M_elems[9] = 0;
        result_3.m_backend.data._M_elems[10] = 0;
        result_3.m_backend.data._M_elems[0xb] = 0;
        result_3.m_backend.data._M_elems[0xc] = 0;
        result_3.m_backend.data._M_elems[0xd] = 0;
        result_3.m_backend.data._M_elems._56_5_ = 0;
        result_3.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_3.m_backend,
                   &(this->theLRbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&oldRhs->m_backend);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems._56_5_ = 0;
        result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&result_1.m_backend,&result.m_backend,&result_3.m_backend);
      }
      local_3f8.data._M_elems[0xf]._1_3_ = result_1.m_backend.data._M_elems[0xf]._1_3_;
      local_3f8.data._M_elems._56_5_ = result_1.m_backend.data._M_elems._56_5_;
      local_3f8.data._M_elems._0_8_ = result_1.m_backend.data._M_elems._0_8_;
      local_3f8.data._M_elems._8_8_ = result_1.m_backend.data._M_elems._8_8_;
      local_3f8.data._M_elems._16_8_ = result_1.m_backend.data._M_elems._16_8_;
      local_3f8.data._M_elems._24_8_ = result_1.m_backend.data._M_elems._24_8_;
      local_3f8.data._M_elems._32_8_ = result_1.m_backend.data._M_elems._32_8_;
      local_3f8.data._M_elems._40_8_ = result_1.m_backend.data._M_elems._40_8_;
      local_3f8.data._M_elems._48_8_ = result_1.m_backend.data._M_elems._48_8_;
      local_3f8.exp = result_1.m_backend.exp;
      local_3f8.neg = result_1.m_backend.neg;
      local_3f8._72_8_ = result_1.m_backend._72_8_;
    }
    else {
      local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRhs->m_backend).data._M_elems;
      local_218.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((newRhs->m_backend).data._M_elems + 2);
      local_218.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((newRhs->m_backend).data._M_elems + 4);
      local_218.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((newRhs->m_backend).data._M_elems + 6);
      local_218.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
      local_218.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((newRhs->m_backend).data._M_elems + 10);
      local_218.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xc);
      local_218.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((newRhs->m_backend).data._M_elems + 0xe);
      local_218.m_backend.exp = (newRhs->m_backend).exp;
      local_218.m_backend.neg = (newRhs->m_backend).neg;
      local_218.m_backend.fpclass = (newRhs->m_backend).fpclass;
      local_218.m_backend.prec_elem = (newRhs->m_backend).prec_elem;
      local_d8.m_backend.data._M_elems[0] = currLhs.m_backend.data._M_elems[0];
      local_d8.m_backend.data._M_elems[1] = currLhs.m_backend.data._M_elems[1];
      local_d8.m_backend.data._M_elems[2] = currLhs.m_backend.data._M_elems[2];
      local_d8.m_backend.data._M_elems[3] = currLhs.m_backend.data._M_elems[3];
      local_d8.m_backend.data._M_elems[4] = currLhs.m_backend.data._M_elems[4];
      local_d8.m_backend.data._M_elems[5] = currLhs.m_backend.data._M_elems[5];
      local_d8.m_backend.data._M_elems[6] = currLhs.m_backend.data._M_elems[6];
      local_d8.m_backend.data._M_elems[7] = currLhs.m_backend.data._M_elems[7];
      local_d8.m_backend.data._M_elems[8] = currLhs.m_backend.data._M_elems[8];
      local_d8.m_backend.data._M_elems[9] = currLhs.m_backend.data._M_elems[9];
      local_d8.m_backend.data._M_elems[10] = currLhs.m_backend.data._M_elems[10];
      local_d8.m_backend.data._M_elems[0xb] = currLhs.m_backend.data._M_elems[0xb];
      local_d8.m_backend.data._M_elems[0xc] = currLhs.m_backend.data._M_elems[0xc];
      local_d8.m_backend.data._M_elems[0xd] = currLhs.m_backend.data._M_elems[0xd];
      local_d8.m_backend.data._M_elems[0xe] = currLhs.m_backend.data._M_elems[0xe];
      local_d8.m_backend.data._M_elems[0xf] = currLhs.m_backend.data._M_elems[0xf];
      local_d8.m_backend.exp = iVar2;
      local_d8.m_backend.neg = bVar10;
      local_d8.m_backend.fpclass = fVar3;
      local_d8.m_backend.prec_elem = iVar4;
      RVar7 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      bVar10 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_218,&local_d8,RVar7);
      if (bVar10) {
        pSVar5[i] = P_FIXED;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar6 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar6 = (this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems._56_5_ = 0;
      result.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result.m_backend,&newRhs->m_backend,&oldRhs->m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems._56_5_ = 0;
      result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_1.m_backend,&pnVar6[i].m_backend,&result.m_backend);
      local_3f8.data._M_elems[0xf]._1_3_ = result_1.m_backend.data._M_elems[0xf]._1_3_;
      local_3f8.data._M_elems._56_5_ = result_1.m_backend.data._M_elems._56_5_;
      local_3f8.data._M_elems._0_8_ = result_1.m_backend.data._M_elems._0_8_;
      local_3f8.data._M_elems._8_8_ = result_1.m_backend.data._M_elems._8_8_;
      local_3f8.data._M_elems._16_8_ = result_1.m_backend.data._M_elems._16_8_;
      local_3f8.data._M_elems._24_8_ = result_1.m_backend.data._M_elems._24_8_;
      local_3f8.data._M_elems._32_8_ = result_1.m_backend.data._M_elems._32_8_;
      local_3f8.data._M_elems._40_8_ = result_1.m_backend.data._M_elems._40_8_;
      local_3f8.data._M_elems._48_8_ = result_1.m_backend.data._M_elems._48_8_;
      local_3f8.exp = result_1.m_backend.exp;
      local_3f8.neg = result_1.m_backend.neg;
      local_3f8._72_8_ = result_1.m_backend._72_8_;
    }
    break;
  case P_FREE:
    pdVar12 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&result_1.m_backend,*pdVar12,(type *)0x0);
    tVar9 = boost::multiprecision::operator<
                      (newRhs,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result_1.m_backend);
    if (((tVar9) && (pSVar5[i] = P_ON_UPPER, this->m_nonbasicValueUpToDate == true)) &&
       (this->theRep == COLUMN)) {
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x10;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems._56_5_ = 0;
      result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_1.m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newRhs->m_backend);
      local_3f8.data._M_elems[0xf]._1_3_ = result_1.m_backend.data._M_elems[0xf]._1_3_;
      local_3f8.data._M_elems._56_5_ = result_1.m_backend.data._M_elems._56_5_;
      local_3f8.data._M_elems._0_8_ = result_1.m_backend.data._M_elems._0_8_;
      local_3f8.data._M_elems._8_8_ = result_1.m_backend.data._M_elems._8_8_;
      local_3f8.data._M_elems._16_8_ = result_1.m_backend.data._M_elems._16_8_;
      local_3f8.data._M_elems._24_8_ = result_1.m_backend.data._M_elems._24_8_;
      local_3f8.data._M_elems._32_8_ = result_1.m_backend.data._M_elems._32_8_;
      local_3f8.data._M_elems._40_8_ = result_1.m_backend.data._M_elems._40_8_;
      local_3f8.data._M_elems._48_8_ = result_1.m_backend.data._M_elems._48_8_;
      local_3f8.exp = result_1.m_backend.exp;
      local_3f8.neg = result_1.m_backend.neg;
      local_3f8._72_8_ = result_1.m_backend._72_8_;
    }
  }
  if (this->theRep == COLUMN) {
    local_1c8.m_backend.data._M_elems[0xc] = local_3f8.data._M_elems[0xc];
    local_1c8.m_backend.data._M_elems[0xd] = local_3f8.data._M_elems[0xd];
    local_1c8.m_backend.data._M_elems[0xe] = local_3f8.data._M_elems[0xe];
    local_1c8.m_backend.data._M_elems[0xf] = local_3f8.data._M_elems[0xf];
    local_1c8.m_backend.data._M_elems[8] = local_3f8.data._M_elems[8];
    local_1c8.m_backend.data._M_elems[9] = local_3f8.data._M_elems[9];
    local_1c8.m_backend.data._M_elems[10] = local_3f8.data._M_elems[10];
    local_1c8.m_backend.data._M_elems[0xb] = local_3f8.data._M_elems[0xb];
    local_1c8.m_backend.data._M_elems[4] = local_3f8.data._M_elems[4];
    local_1c8.m_backend.data._M_elems[5] = local_3f8.data._M_elems[5];
    local_1c8.m_backend.data._M_elems[6] = local_3f8.data._M_elems[6];
    local_1c8.m_backend.data._M_elems[7] = local_3f8.data._M_elems[7];
    local_1c8.m_backend.data._M_elems[0] = local_3f8.data._M_elems[0];
    local_1c8.m_backend.data._M_elems[1] = local_3f8.data._M_elems[1];
    local_1c8.m_backend.data._M_elems[2] = local_3f8.data._M_elems[2];
    local_1c8.m_backend.data._M_elems[3] = local_3f8.data._M_elems[3];
    local_1c8.m_backend.exp = local_3f8.exp;
    local_1c8.m_backend.neg = local_3f8.neg;
    local_1c8.m_backend.fpclass = local_3f8.fpclass;
    local_1c8.m_backend.prec_elem = local_3f8.prec_elem;
    updateNonbasicValue(this,&local_1c8);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRhsStatus(int i, R newRhs, R oldRhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currLhs   = this->lhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG04 changeRhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(newRhs >= R(infinity))
      {
         if(currLhs <= R(-infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theLRbound[i] * oldRhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theURbound[i] * currLhs) - (theLRbound[i] * oldRhs);
         }
      }
      else if(EQ(newRhs, currLhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newRhs - oldRhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theLRbound[i] * (newRhs - oldRhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(EQ(newRhs, currLhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newRhs < R(infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theLRbound[i] * newRhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newRhs, currLhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(isInitialized())
            theURbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG04 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}